

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  TokenTypePair pair;
  Module *module_local;
  WastParser *this_local;
  
  while( true ) {
    pair = PeekPair(this);
    bVar1 = anon_unknown_1::IsModuleField(pair);
    if (!bVar1) break;
    RVar2 = ParseModuleField(this,module);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      RVar2 = Synchronize(this,anon_unknown_1::IsModuleField);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
  }
  RVar2 = anon_unknown_1::ResolveFuncTypes(module,this->errors_);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  RVar2 = ResolveNamesModule(module,this->errors_);
  bVar1 = Failed(RVar2);
  if (!bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
    return (Result)this_local._4_4_;
  }
  Result::Result((Result *)((long)&this_local + 4),Error);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);
  while (IsModuleField(PeekPair())) {
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }
  CHECK_RESULT(ResolveFuncTypes(module, errors_));
  CHECK_RESULT(ResolveNamesModule(module, errors_));
  return Result::Ok;
}